

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::add_instruction(ModuleParseContext *this,Instruction *inst)

{
  undefined8 uVar1;
  bool bVar2;
  void *pvVar3;
  char local_1028 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Instruction *inst_local;
  ModuleParseContext *this_local;
  
  cb = (_func_void_void_ptr_LogLevel_char_ptr *)inst;
  inst_local = (Instruction *)this;
  std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>::
  push_back(&this->instructions,(value_type *)&cb);
  if (this->current_bb == (BasicBlock *)0x0) {
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: No basic block is currently set!\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1028,0x1000,"No basic block is currently set!\n");
      uVar1 = buffer._4088_8_;
      pvVar3 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar3,2,local_1028);
    }
    this_local._7_1_ = false;
  }
  else {
    BasicBlock::add_instruction(this->current_bb,(Instruction *)cb);
    bVar2 = Instruction::isTerminator((Instruction *)cb);
    if (bVar2) {
      this_local._7_1_ = finish_basic_block(this);
    }
    else {
      this_local._7_1_ = add_value(this,(Value *)cb);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ModuleParseContext::add_instruction(Instruction *inst)
{
	instructions.push_back(inst);

	if (current_bb)
		current_bb->add_instruction(inst);
	else
	{
		LOGE("No basic block is currently set!\n");
		return false;
	}

	if (inst->isTerminator())
		return finish_basic_block();
	else
		return add_value(inst);
}